

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::tfhd::parse(tfhd *this,char *ptr)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  box::parse((box *)this,ptr);
  uVar4 = (ulong)((uint)(this->super_full_box).super_box.has_uuid_ * 0x10 +
                 (uint)(this->super_full_box).super_box.is_large_ * 8);
  uVar1 = *(uint *)(ptr + uVar4 + 8);
  (this->super_full_box).magic_conf_ =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  (this->super_full_box).super_box.field_0x62 = ptr[uVar4 + 8];
  uVar1 = *(uint *)(ptr + uVar4 + 8);
  bVar3 = (byte)(uVar1 >> 0x18);
  uVar2 = (uVar1 & 0xff00) << 8;
  *(uint *)&(this->super_full_box).super_box.field_0x64 =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | uVar2;
  uVar5 = *(uint *)(ptr + 0xc);
  this->track_id_ = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  uVar5 = 0x10;
  (this->super_full_box).field_0x6c = bVar3 & 1;
  (this->super_full_box).field_0x6d = bVar3 >> 1 & 1;
  (this->super_full_box).field_0x6e = bVar3 >> 3 & 1;
  (this->super_full_box).field_0x6f = bVar3 >> 4 & 1;
  this->default_sample_flags_present_ = (bool)(bVar3 >> 5 & 1);
  this->duration_is_empty_ = (bool)((byte)((uVar1 & 0xff00) >> 8) & 1);
  this->default_base_is_moof_ = (bool)((byte)(uVar2 >> 0x11) & 1);
  if ((uVar1 & 0x1000000) != 0) {
    uVar1 = *(uint *)(ptr + 0x10);
    this->base_data_offset_ =
         (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
    uVar5 = 0x14;
  }
  if ((bVar3 >> 1 & 1) != 0) {
    uVar1 = *(uint *)(ptr + uVar5);
    this->sample_description_index_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar5 = uVar5 + 4;
  }
  if ((bVar3 >> 3 & 1) != 0) {
    uVar1 = *(uint *)(ptr + uVar5);
    this->default_sample_duration_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar5 = uVar5 + 4;
  }
  if ((bVar3 >> 4 & 1) != 0) {
    uVar1 = *(uint *)(ptr + uVar5);
    this->default_sample_size_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar5 = uVar5 + 4;
  }
  if ((bVar3 >> 5 & 1) != 0) {
    uVar1 = *(uint *)(ptr + uVar5);
    this->default_sample_flags_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  return;
}

Assistant:

void tfhd::parse(const char * ptr)
	{
		full_box::parse(ptr);
		track_id_ = fmp4_read_uint32(ptr + 12);
		base_data_offset_present_ = !! (0x1u) & flags_;
		sample_description_index_present_ = !!(0x2u & flags_);
		default_sample_duration_present_ = !!(0x00000008u & flags_);
		default_sample_size_present_ = !!(0x00000010u & flags_);
		default_sample_flags_present_ = !!(0x00000020u & flags_);
		duration_is_empty_ = !!(0x00010000u & flags_);
		default_base_is_moof_ = !!(0x00020000u & flags_);

		unsigned int offset = 16;

		if (base_data_offset_present_)
		{
			base_data_offset_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (sample_description_index_present_)
		{
			sample_description_index_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (default_sample_duration_present_)
		{
			default_sample_duration_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (default_sample_size_present_)
		{
			default_sample_size_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		if (default_sample_flags_present_)
		{
			default_sample_flags_ = (uint32_t)fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
	}